

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridges_articulations.cpp
# Opt level: O3

void find_bridges_and_articulations(void)

{
  int iVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  pointer pvVar4;
  long lVar5;
  ulong *puVar6;
  int iVar7;
  pointer piVar8;
  uint uVar9;
  ulong *puVar10;
  ulong uVar11;
  pair<int,_int> *bridge;
  key_type *__k;
  ulong uVar12;
  ulong uVar13;
  int cur;
  uint local_44;
  uint *local_40;
  uint *local_38;
  
  freopen("bridges_and_articulations.txt","w",_stdout);
  uVar12 = 0;
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)&(anonymous_namespace)::used,(long)V,false);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::tin,(long)V);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::fout,(long)V);
  lVar5 = (anonymous_namespace)::used;
  iVar1 = V;
  if (0 < V) {
    do {
      if ((*(ulong *)(lVar5 + (uVar12 >> 6) * 8) >> (uVar12 & 0x3f) & 1) == 0) {
        dfs((int)uVar12,-1);
        lVar5 = (anonymous_namespace)::used;
        iVar1 = V;
      }
      uVar9 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar9;
    } while ((int)uVar9 < iVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bridges:",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  if ((anonymous_namespace)::bridges != DAT_00119200) {
    local_40 = (uint *)DAT_00119200;
    __k = (anonymous_namespace)::bridges;
    do {
      pmVar2 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&name_abi_cxx11_,__k);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
      iVar1 = count_from(*__k,__k[1],true);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") - ",4);
      pmVar2 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&name_abi_cxx11_,__k + 1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
      iVar1 = count_from(__k[1],*__k,true);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
      __k = __k + 2;
    } while ((uint *)__k != local_40);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Articulation points:",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_38 = DAT_001191e8;
  local_40 = (anonymous_namespace)::articulations;
  if ((anonymous_namespace)::articulations != DAT_001191e8) {
    do {
      local_44 = *local_40;
      pmVar2 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&name_abi_cxx11_,(key_type *)&local_44);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
      iVar1 = DAT_001191a0;
      puVar6 = DAT_00119198;
      puVar10 = (anonymous_namespace)::usedcnt;
      if ((anonymous_namespace)::usedcnt != DAT_00119198) {
        memset((anonymous_namespace)::usedcnt,0,
               (long)DAT_00119198 - (long)(anonymous_namespace)::usedcnt);
        puVar10 = puVar6;
      }
      if (iVar1 != 0) {
        *puVar10 = *puVar10 & ~(0xffffffffffffffffU >> (-(char)iVar1 & 0x3fU));
      }
      uVar12 = (ulong)(int)local_44;
      piVar8 = edge.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar12].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (edge.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar12].
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
          piVar8) {
        uVar11 = 0;
        pvVar4 = edge.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar6 = (anonymous_namespace)::usedcnt;
        do {
          iVar1 = piVar8[uVar11];
          uVar13 = (ulong)iVar1;
          iVar7 = iVar1 + 0x3f;
          if (-1 < (long)uVar13) {
            iVar7 = iVar1;
          }
          if ((puVar6[(long)(iVar7 >> 6) +
                      ((ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
               (uVar13 & 0x3f) & 1) == 0) {
            std::vector<bool,_std::allocator<bool>_>::resize
                      ((vector<bool,_std::allocator<bool>_> *)&(anonymous_namespace)::usedcnt,
                       (long)V,false);
            iVar1 = count_rec(iVar1,(int)uVar12);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
            uVar12 = (ulong)local_44;
            pvVar4 = edge.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar6 = (anonymous_namespace)::usedcnt;
          }
          uVar11 = uVar11 + 1;
          piVar8 = pvVar4[(int)uVar12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar11 < (ulong)((long)pvVar4[(int)uVar12].
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar8 >> 2));
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      local_40 = local_40 + 1;
    } while (local_40 != local_38);
  }
  return;
}

Assistant:

void find_bridges_and_articulations() {
    freopen("bridges_and_articulations.txt", "w", stdout); // output file

    used.resize(V, false);
    tin.resize(V);
    fout.resize(V);

    for (int i = 0; i < V; i++)
        if (!used[i])
            dfs(i);
    
    cout << "Bridges:" << endl;
    for (const auto& bridge : bridges) {
        cout << name[bridge.first]
             << " (" << count_from(bridge.first, bridge.second)
             << ") - " << name[bridge.second]
             << " (" << count_from(bridge.second, bridge.first)
             << ")\n";
    }
    
    
    cout << endl << "Articulation points:" << endl;  
    for (int cur : articulations) {
        cout << name[cur];
        
        fill(usedcnt.begin(), usedcnt.end(), false);
            
        for (int j = 0; j < edge[cur].size(); j++) {
            if (!usedcnt[edge[cur][j]]) {
                int comp_size = count_from(edge[cur][j], cur, false); 
                cout << " (" << comp_size << ")";
            }
        }
        cout << endl;
    }
}